

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closeAllCursors(Vdbe *p)

{
  AuxData **in_RDI;
  VdbeFrame *pDel;
  VdbeFrame *pFrame;
  Vdbe *in_stack_fffffffffffffff0;
  
  if (in_RDI[0x21] != (AuxData *)0x0) {
    for (in_stack_fffffffffffffff0 = (Vdbe *)in_RDI[0x21];
        (VdbeFrame *)in_stack_fffffffffffffff0->ppVPrev != (VdbeFrame *)0x0;
        in_stack_fffffffffffffff0 = (Vdbe *)in_stack_fffffffffffffff0->ppVPrev) {
    }
    sqlite3VdbeFrameRestore((VdbeFrame *)in_stack_fffffffffffffff0);
    in_RDI[0x21] = (AuxData *)0x0;
    *(undefined4 *)(in_RDI + 0x23) = 0;
  }
  closeCursorsInFrame(in_stack_fffffffffffffff0);
  releaseMemArray((Mem *)pDel,(int)((ulong)in_RDI >> 0x20));
  while (in_RDI[0x22] != (AuxData *)0x0) {
    in_RDI[0x22] = (AuxData *)in_RDI[0x22]->pAux;
    sqlite3VdbeFrameDelete(pDel);
  }
  if (in_RDI[0x25] != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData
              ((sqlite3 *)pDel,in_RDI,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20),
               (int)in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

static void closeAllCursors(Vdbe *p){
  if( p->pFrame ){
    VdbeFrame *pFrame;
    for(pFrame=p->pFrame; pFrame->pParent; pFrame=pFrame->pParent);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = 0;
    p->nFrame = 0;
  }
  assert( p->nFrame==0 );
  closeCursorsInFrame(p);
  releaseMemArray(p->aMem, p->nMem);
  while( p->pDelFrame ){
    VdbeFrame *pDel = p->pDelFrame;
    p->pDelFrame = pDel->pParent;
    sqlite3VdbeFrameDelete(pDel);
  }

  /* Delete any auxdata allocations made by the VM */
  if( p->pAuxData ) sqlite3VdbeDeleteAuxData(p->db, &p->pAuxData, -1, 0);
  assert( p->pAuxData==0 );
}